

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextProcessDock(ImGuiContext *ctx,ImGuiDockRequest *req)

{
  ImGuiTabItemFlags *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiID IVar3;
  ImGuiWindow *window;
  ImGuiWindow *window_00;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  uint uVar6;
  ImGuiDockNode *node;
  ImGuiDockNode *pIVar7;
  ImGuiDockNode *pIVar8;
  ulong uVar9;
  ImGuiDockNode *node_00;
  uint uVar10;
  ImGuiDockNode *pIVar11;
  ImGuiDockNode *src_node;
  long lVar12;
  ImGuiDockNode *pIVar13;
  ImGuiID IVar14;
  bool bVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  if (req->Type == ImGuiDockRequestType_Split) {
    if (req->DockPayload == (ImGuiWindow *)0x0) {
LAB_0016ca3b:
      window = req->DockTargetWindow;
      if ((window == (ImGuiWindow *)0x0) && (req->DockTargetNode == (ImGuiDockNode *)0x0)) {
        __assert_fail("req->DockTargetWindow != __null || req->DockTargetNode != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x3724,
                      "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
      }
      node = req->DockTargetNode;
      window_00 = req->DockPayload;
      if (window_00 == (ImGuiWindow *)0x0) {
        src_node = (ImGuiDockNode *)0x0;
        IVar14 = 0;
      }
      else {
        src_node = window_00->DockNodeAsHost;
        window_00->DockNodeAsHost = (ImGuiDockNode *)0x0;
        IVar14 = 0;
        if ((src_node != (ImGuiDockNode *)0x0) &&
           (IVar14 = 0, src_node->ChildNodes[0] == (ImGuiDockNode *)0x0)) {
          IVar14 = src_node->TabBar->NextSelectedTabId;
          if (IVar14 == 0) {
            IVar14 = src_node->TabBar->SelectedTabId;
          }
        }
        if (src_node == (ImGuiDockNode *)0x0) {
          IVar14 = window_00->TabId;
          src_node = (ImGuiDockNode *)0x0;
        }
      }
      if ((node != (ImGuiDockNode *)0x0) && (ctx->FrameCount < node->LastFrameAlive)) {
        __assert_fail("node->LastFrameAlive <= g.FrameCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x3741,
                      "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
      }
      if ((((window != (ImGuiWindow *)0x0 && node != (ImGuiDockNode *)0x0) &&
           (node == window->DockNodeAsHost)) && ((node->Windows).Size < 1)) &&
         ((node->ChildNodes[0] == (ImGuiDockNode *)0x0 && ((node->MergedFlags & 0x800) == 0)))) {
        __assert_fail("node->Windows.Size > 0 || node->IsSplitNode() || node->IsCentralNode()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x3743,
                      "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
      }
      if (node == (ImGuiDockNode *)0x0) {
        node = DockContextAddNode(ctx,0);
        node->Pos = window->Pos;
        node->Size = window->Size;
        if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
          DockNodeAddWindow(node,window,true);
          if ((node->TabBar->Tabs).Size < 1) {
            __assert_fail("i >= 0 && i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                          ,0x74f,"T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]");
          }
          pIVar1 = &((node->TabBar->Tabs).Data)->Flags;
          *pIVar1 = *pIVar1 & 0xffbfffff;
          window->field_0x3f9 = window->field_0x3f9 | 1;
        }
      }
      pIVar5 = GImGui;
      uVar6 = req->DockSplitDir;
      if (uVar6 != 0xffffffff) {
        fVar18 = req->DockSplitRatio;
        pIVar7 = src_node;
        if (src_node == (ImGuiDockNode *)0x0 || (uVar6 & 0xfffffffd) != 0) {
          pIVar7 = DockContextAddNode(ctx,0);
        }
        pIVar7->ParentNode = node;
        if ((src_node == (ImGuiDockNode *)0x0) || (pIVar8 = src_node, (uVar6 & 0xfffffffd) == 0)) {
          pIVar8 = DockContextAddNode(ctx,0);
        }
        bVar15 = (uVar6 & 0xfffffffd) == 0;
        pIVar8->ParentNode = node;
        pIVar13 = pIVar7;
        if (bVar15) {
          pIVar13 = pIVar8;
        }
        DockNodeMoveChildNodes(pIVar13,node);
        node->ChildNodes[0] = pIVar7;
        node->ChildNodes[1] = pIVar8;
        node->ChildNodes[bVar15]->VisibleWindow = node->VisibleWindow;
        node->SplitAxis = (uint)(1 < uVar6);
        node->VisibleWindow = (ImGuiWindow *)0x0;
        *(ushort *)&node->field_0xc4 = (ushort)*(undefined4 *)&node->field_0xc4 & 0xffc0 | 9;
        uVar9 = (ulong)((uint)(1 < uVar6) * 4);
        fVar17 = *(float *)((long)node->ChildNodes + uVar9 + 0x30) + -2.0;
        fVar19 = *(float *)((long)&(pIVar5->Style).WindowMinSize.x + uVar9);
        fVar19 = fVar19 + fVar19;
        uVar16 = -(uint)(fVar19 <= fVar17);
        fVar19 = (float)(~uVar16 & (uint)fVar19 | (uint)fVar17 & uVar16);
        if (fVar19 <= 0.0) {
          __assert_fail("size_avail > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x3e17,
                        "void ImGui::DockNodeTreeSplit(ImGuiContext *, ImGuiDockNode *, ImGuiAxis, int, float, ImGuiDockNode *)"
                       );
        }
        IVar4 = node->Size;
        pIVar8->SizeRef = IVar4;
        pIVar7->SizeRef = IVar4;
        fVar18 = (float)(int)(fVar18 * fVar19);
        lVar12 = (ulong)(1 < uVar6) * 4;
        *(float *)((long)pIVar7->ChildNodes + lVar12 + 0x38) = fVar18;
        *(float *)((long)pIVar8->ChildNodes + lVar12 + 0x38) = (float)(int)(fVar19 - fVar18);
        DockNodeMoveWindows(node->ChildNodes[bVar15],node);
        DockSettingsRenameNodeReferences(node->ID,node->ChildNodes[bVar15]->ID);
        pIVar11 = node;
        do {
          node_00 = pIVar11;
          pIVar11 = node_00->ParentNode;
        } while (pIVar11 != (ImGuiDockNode *)0x0);
        DockNodeUpdateHasCentralNodeChild(node_00);
        DockNodeTreeUpdatePosSize(node,node->Pos,node->Size,(ImGuiDockNode *)0x0);
        pIVar7->SharedFlags = node->SharedFlags;
        uVar16 = node->SharedFlags;
        pIVar8->SharedFlags = uVar16;
        pIVar13->LocalFlags = node->LocalFlags & 0xc1f870;
        uVar10 = node->LocalFlags & 0xff3e078f;
        node->LocalFlags = uVar10;
        pIVar7->MergedFlags = pIVar7->LocalFlags | pIVar7->SharedFlags | pIVar7->LocalFlagsInWindows
        ;
        pIVar8->MergedFlags = pIVar8->LocalFlags | pIVar8->LocalFlagsInWindows | uVar16;
        node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar10;
        pIVar7 = node;
        if ((pIVar13->MergedFlags & 0x800) != 0) {
          do {
            pIVar8 = pIVar7;
            pIVar7 = pIVar8->ParentNode;
          } while (pIVar7 != (ImGuiDockNode *)0x0);
          pIVar8->CentralNode = pIVar13;
        }
        ppIVar2 = &node->HostWindow;
        node = node->ChildNodes[(uVar6 & 0xfffffffd) != 0];
        node->HostWindow = *ppIVar2;
      }
      uVar6 = node->LocalFlags & 0xffffdfff;
      node->LocalFlags = uVar6;
      node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar6;
      if (node == src_node) {
        node->field_0xc6 = node->field_0xc6 | 4;
      }
      else {
        if (((0 < (node->Windows).Size) && (node->TabBar == (ImGuiTabBar *)0x0)) &&
           (DockNodeAddTabBar(node), 0 < (node->Windows).Size)) {
          lVar12 = 0;
          do {
            TabBarAddTab(node->TabBar,0,(node->Windows).Data[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 < (node->Windows).Size);
        }
        if (src_node == (ImGuiDockNode *)0x0) {
          if (window_00 != (ImGuiWindow *)0x0) {
            IVar3 = window_00->DockId;
            node->VisibleWindow = window_00;
            DockNodeAddWindow(node,window_00,true);
            if (IVar3 != 0) {
              DockSettingsRenameNodeReferences(IVar3,node->ID);
            }
          }
        }
        else {
          if (src_node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
            IVar3 = src_node->ID;
            DockNodeMoveWindows(node,src_node);
            DockSettingsRenameNodeReferences(IVar3,node->ID);
          }
          else {
            if (0 < (node->Windows).Size) {
              pIVar7 = src_node->OnlyNodeWithWindows;
              if (pIVar7 == (ImGuiDockNode *)0x0) {
                __assert_fail("payload_node->OnlyNodeWithWindows != __null",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                              ,0x3775,
                              "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                             );
              }
              if ((pIVar7->TabBar != (ImGuiTabBar *)0x0) && ((pIVar7->TabBar->Tabs).Size < 1)) {
                __assert_fail("visible_node->TabBar->Tabs.Size > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                              ,0x3778,
                              "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                             );
              }
              DockNodeMoveWindows(node,pIVar7);
              DockNodeMoveWindows(pIVar7,node);
              DockSettingsRenameNodeReferences(node->ID,pIVar7->ID);
            }
            if ((node->MergedFlags & 0x800) != 0) {
              pIVar8 = (ImGuiDockNode *)
                       ImGuiStorage::GetVoidPtr
                                 (&(ctx->DockContext).Nodes,src_node->LastFocusedNodeId);
              pIVar7 = pIVar8;
              if (pIVar8 == (ImGuiDockNode *)0x0) {
                __assert_fail("last_focused_node != __null",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                              ,0x3782,
                              "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                             );
              }
              do {
                pIVar11 = pIVar7;
                pIVar7 = pIVar11->ParentNode;
                pIVar13 = src_node;
              } while (pIVar11->ParentNode != (ImGuiDockNode *)0x0);
              do {
                pIVar7 = pIVar13;
                pIVar13 = pIVar7->ParentNode;
              } while (pIVar13 != (ImGuiDockNode *)0x0);
              if (pIVar11 != pIVar7) {
                __assert_fail("last_focused_root_node == DockNodeGetRootNode(payload_node)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                              ,0x3784,
                              "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                             );
              }
              uVar6 = pIVar8->LocalFlags | 0x800;
              pIVar8->LocalFlags = uVar6;
              pIVar8->MergedFlags = pIVar8->SharedFlags | pIVar8->LocalFlagsInWindows | uVar6;
              uVar6 = node->LocalFlags & 0xfffff7ff;
              node->LocalFlags = uVar6;
              node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar6;
              pIVar11->CentralNode = pIVar8;
            }
            if ((node->Windows).Size != 0) {
              __assert_fail("node->Windows.Size == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                            ,0x378a,
                            "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                           );
            }
            DockNodeMoveChildNodes(node,src_node);
          }
          DockContextRemoveNode(ctx,src_node,true);
        }
      }
      if (node->TabBar != (ImGuiTabBar *)0x0) {
        node->TabBar->NextSelectedTabId = IVar14;
      }
      if (GImGui->SettingsDirtyTimer <= 0.0) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      return;
    }
  }
  else if ((req->Type == ImGuiDockRequestType_Dock) && (req->DockPayload != (ImGuiWindow *)0x0))
  goto LAB_0016ca3b;
  __assert_fail("(req->Type == ImGuiDockRequestType_Dock && req->DockPayload != __null) || (req->Type == ImGuiDockRequestType_Split && req->DockPayload == __null)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                ,0x3723,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
}

Assistant:

void ImGui::DockContextProcessDock(ImGuiContext* ctx, ImGuiDockRequest* req)
{
    IM_ASSERT((req->Type == ImGuiDockRequestType_Dock && req->DockPayload != NULL) || (req->Type == ImGuiDockRequestType_Split && req->DockPayload == NULL));
    IM_ASSERT(req->DockTargetWindow != NULL || req->DockTargetNode != NULL);

    ImGuiContext& g = *ctx;
    IM_UNUSED(g);

    ImGuiWindow* payload_window = req->DockPayload;     // Optional
    ImGuiWindow* target_window = req->DockTargetWindow;
    ImGuiDockNode* node = req->DockTargetNode;
    if (payload_window)
        IMGUI_DEBUG_LOG_DOCKING("DockContextProcessDock node 0x%08X target '%s' dock window '%s', split_dir %d\n", node ? node->ID : 0, target_window ? target_window->Name : "NULL", payload_window ? payload_window->Name : "NULL", req->DockSplitDir);
    else
        IMGUI_DEBUG_LOG_DOCKING("DockContextProcessDock node 0x%08X, split_dir %d\n", node ? node->ID : 0, req->DockSplitDir);

    // Decide which Tab will be selected at the end of the operation
    ImGuiID next_selected_id = 0;
    ImGuiDockNode* payload_node = NULL;
    if (payload_window)
    {
        payload_node = payload_window->DockNodeAsHost;
        payload_window->DockNodeAsHost = NULL; // Important to clear this as the node will have its life as a child which might be merged/deleted later.
        if (payload_node && payload_node->IsLeafNode())
            next_selected_id = payload_node->TabBar->NextSelectedTabId ? payload_node->TabBar->NextSelectedTabId : payload_node->TabBar->SelectedTabId;
        if (payload_node == NULL)
            next_selected_id = payload_window->TabId;
    }

    // FIXME-DOCK: When we are trying to dock an existing single-window node into a loose window, transfer Node ID as well
    // When processing an interactive split, usually LastFrameAlive will be < g.FrameCount. But DockBuilder operations can make it ==.
    if (node)
        IM_ASSERT(node->LastFrameAlive <= g.FrameCount);
    if (node && target_window && node == target_window->DockNodeAsHost)
        IM_ASSERT(node->Windows.Size > 0 || node->IsSplitNode() || node->IsCentralNode());

    // Create new node and add existing window to it
    if (node == NULL)
    {
        node = DockContextAddNode(ctx, 0);
        node->Pos = target_window->Pos;
        node->Size = target_window->Size;
        if (target_window->DockNodeAsHost == NULL)
        {
            DockNodeAddWindow(node, target_window, true);
            node->TabBar->Tabs[0].Flags &= ~ImGuiTabItemFlags_Unsorted;
            target_window->DockIsActive = true;
        }
    }

    ImGuiDir split_dir = req->DockSplitDir;
    if (split_dir != ImGuiDir_None)
    {
        // Split into two, one side will be our payload node unless we are dropping a loose window
        const ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        const int split_inheritor_child_idx = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 1 : 0; // Current contents will be moved to the opposite side
        const float split_ratio = req->DockSplitRatio;
        DockNodeTreeSplit(ctx, node, split_axis, split_inheritor_child_idx, split_ratio, payload_node);  // payload_node may be NULL here!
        ImGuiDockNode* new_node = node->ChildNodes[split_inheritor_child_idx ^ 1];
        new_node->HostWindow = node->HostWindow;
        node = new_node;
    }
    node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_HiddenTabBar);

    if (node != payload_node)
    {
        // Create tab bar before we call DockNodeMoveWindows (which would attempt to move the old tab-bar, which would lead us to payload tabs wrongly appearing before target tabs!)
        if (node->Windows.Size > 0 && node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            for (int n = 0; n < node->Windows.Size; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }

        if (payload_node != NULL)
        {
            // Transfer full payload node (with 1+ child windows or child nodes)
            if (payload_node->IsSplitNode())
            {
                if (node->Windows.Size > 0)
                {
                    // We can dock a split payload into a node that already has windows _only_ if our payload is a node tree with a single visible node.
                    // In this situation, we move the windows of the target node into the currently visible node of the payload.
                    // This allows us to preserve some of the underlying dock tree settings nicely.
                    IM_ASSERT(payload_node->OnlyNodeWithWindows != NULL); // The docking should have been blocked by DockNodePreviewDockSetup() early on and never submitted.
                    ImGuiDockNode* visible_node = payload_node->OnlyNodeWithWindows;
                    if (visible_node->TabBar)
                        IM_ASSERT(visible_node->TabBar->Tabs.Size > 0);
                    DockNodeMoveWindows(node, visible_node);
                    DockNodeMoveWindows(visible_node, node);
                    DockSettingsRenameNodeReferences(node->ID, visible_node->ID);
                }
                if (node->IsCentralNode())
                {
                    // Central node property needs to be moved to a leaf node, pick the last focused one.
                    // FIXME-DOCK: If we had to transfer other flags here, what would the policy be?
                    ImGuiDockNode* last_focused_node = DockContextFindNodeByID(ctx, payload_node->LastFocusedNodeId);
                    IM_ASSERT(last_focused_node != NULL);
                    ImGuiDockNode* last_focused_root_node = DockNodeGetRootNode(last_focused_node);
                    IM_ASSERT(last_focused_root_node == DockNodeGetRootNode(payload_node));
                    last_focused_node->SetLocalFlags(last_focused_node->LocalFlags | ImGuiDockNodeFlags_CentralNode);
                    node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_CentralNode);
                    last_focused_root_node->CentralNode = last_focused_node;
                }

                IM_ASSERT(node->Windows.Size == 0);
                DockNodeMoveChildNodes(node, payload_node);
            }
            else
            {
                const ImGuiID payload_dock_id = payload_node->ID;
                DockNodeMoveWindows(node, payload_node);
                DockSettingsRenameNodeReferences(payload_dock_id, node->ID);
            }
            DockContextRemoveNode(ctx, payload_node, true);
        }
        else if (payload_window)
        {
            // Transfer single window
            const ImGuiID payload_dock_id = payload_window->DockId;
            node->VisibleWindow = payload_window;
            DockNodeAddWindow(node, payload_window, true);
            if (payload_dock_id != 0)
                DockSettingsRenameNodeReferences(payload_dock_id, node->ID);
        }
    }
    else
    {
        // When docking a floating single window node we want to reevaluate auto-hiding of the tab bar
        node->WantHiddenTabBarUpdate = true;
    }

    // Update selection immediately
    if (ImGuiTabBar* tab_bar = node->TabBar)
        tab_bar->NextSelectedTabId = next_selected_id;
    MarkIniSettingsDirty();
}